

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O3

void __thiscall Refal2::CLeftPartCompiler::matchLeftParens(CLeftPartCompiler *this)

{
  CNodeType *toNode;
  CNodeType *fromNode;
  CNodeType *nodeAfter;
  int iVar1;
  undefined4 extraout_var;
  CHoleNode *this_00;
  CNodeList<Refal2::CUnit> local_50;
  CNodeList<Refal2::CUnit> local_38;
  int local_20;
  int local_1c;
  
  COperationsBuilder::AddMatchLeftParens((COperationsBuilder *)this);
  this_00 = this->hole;
  toNode = (this_00->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last;
  fromNode = ((((this_00->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first)->
              super_CUnit).field_1.pairedParen)->next;
  local_50.first = (CNodeType *)0x0;
  local_50.last = (CNodeType *)0x0;
  local_50._vptr_CNodeList = (_func_int **)&PTR__CNodeList_00148c78;
  if (fromNode != (CNodeType *)0x0) {
    CNodeList<Refal2::CUnit>::Detach((CNodeList<Refal2::CUnit> *)this_00,fromNode,toNode);
    CNodeList<Refal2::CUnit>::Assign(&local_50,fromNode,toNode);
    this_00 = this->hole;
  }
  CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this_00);
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  nodeAfter = this->hole;
  local_20 = this->top;
  local_38._vptr_CNodeList = (_func_int **)&PTR__CNodeList_00148978;
  local_1c = local_20 + 1;
  local_38.first._0_4_ = local_50.first._0_4_;
  local_38.first._4_4_ = local_50.first._4_4_;
  local_38.last._0_4_ = local_50.last._0_4_;
  local_38.last._4_4_ = local_50.last._4_4_;
  local_50.first = (CNodeType *)0x0;
  local_50.last = (CNodeType *)0x0;
  iVar1 = (*(this->holes)._vptr_CNodeList[3])(&this->holes);
  CNodeList<Refal2::CHole>::InsertAfter
            (&this->holes,nodeAfter,(CNodeType *)CONCAT44(extraout_var,iVar1),
             (CNodeType *)CONCAT44(extraout_var,iVar1));
  CNodeList<Refal2::CUnit>::~CNodeList(&local_38);
  this->top = this->top + 2;
  CNodeList<Refal2::CUnit>::~CNodeList(&local_50);
  return;
}

Assistant:

void CLeftPartCompiler::matchLeftParens()
{
	COperationsBuilder::AddMatchLeftParens();
	
	CUnitNode* begin = hole->GetFirst();
	CUnitNode* end = hole->GetLast();
	CUnitNode* beginNew = begin->PairedParen()->Next();
	CUnitNode* endNew = 0;

	CUnitList newHole;
	if( beginNew != 0 ) {
		endNew = end;
		hole->Detach( beginNew, endNew );
		newHole.Assign( beginNew, endNew );
	}
	
	hole->RemoveFirst();
	hole->RemoveLast();

	holes.InsertAfter( hole, CHole( newHole, top, top + 1 ) );
	top += 2;
}